

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeFrameRestore(VdbeFrame *pFrame)

{
  AuxData **in_RDI;
  sqlite3 *unaff_retaddr;
  Vdbe *v;
  Vdbe *p;
  
  p = (Vdbe *)*in_RDI;
  closeCursorsInFrame(p);
  p->aOp = (Op *)in_RDI[2];
  p->nOp = *(int *)(in_RDI + 10);
  p->aMem = (Mem *)in_RDI[3];
  p->nMem = *(int *)((long)in_RDI + 0x54);
  p->apCsr = (VdbeCursor **)in_RDI[4];
  p->nCursor = *(int *)(in_RDI + 9);
  p->db->lastRowid = (i64)in_RDI[7];
  p->nChange = (i64)in_RDI[0xc];
  p->db->nChange = (i64)in_RDI[0xd];
  sqlite3VdbeDeleteAuxData(unaff_retaddr,in_RDI,(int)((ulong)p >> 0x20),(int)p);
  p->pAuxData = in_RDI[8];
  in_RDI[8] = (AuxData *)0x0;
  return *(int *)((long)in_RDI + 0x4c);
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeFrameRestore(VdbeFrame *pFrame){
  Vdbe *v = pFrame->v;
  closeCursorsInFrame(v);
  v->aOp = pFrame->aOp;
  v->nOp = pFrame->nOp;
  v->aMem = pFrame->aMem;
  v->nMem = pFrame->nMem;
  v->apCsr = pFrame->apCsr;
  v->nCursor = pFrame->nCursor;
  v->db->lastRowid = pFrame->lastRowid;
  v->nChange = pFrame->nChange;
  v->db->nChange = pFrame->nDbChange;
  sqlite3VdbeDeleteAuxData(v->db, &v->pAuxData, -1, 0);
  v->pAuxData = pFrame->pAuxData;
  pFrame->pAuxData = 0;
  return pFrame->pc;
}